

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PIT.hpp
# Opt level: O2

void __thiscall
PCCompatible::i8253<false,_PCCompatible::PITObserver>::set_mode
          (i8253<false,_PCCompatible::PITObserver> *this,uint8_t value)

{
  (*(code *)(&DAT_0046aa30 + *(int *)(&DAT_0046aa30 + (ulong)(value >> 6) * 4)))();
  return;
}

Assistant:

void set_mode(uint8_t value) {
			const int channel_id = (value >> 6) & 3;
			if(channel_id == 3) {
				// TODO: decode rest of read-back command.
				read_back_ = is_8254;
				return;
			}
			switch(channel_id) {
				case 0:	channels_[0].template set_mode<0>(observer_, value);	break;
				case 1:	channels_[1].template set_mode<1>(observer_, value);	break;
				case 2:	channels_[2].template set_mode<2>(observer_, value);	break;
			}
		}